

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Builder * __thiscall
capnp::_::PointerBuilder::getBlob<capnp::Text>
          (Builder *__return_storage_ptr__,PointerBuilder *this,void *defaultValue,
          ByteCount defaultSize)

{
  word *pwVar1;
  BuilderArena *this_00;
  SegmentBuilder *this_01;
  ulong uVar2;
  CapTableBuilder *capTable;
  WirePointer *pWVar3;
  WirePointer *pWVar4;
  WirePointer *ref;
  uint uVar5;
  AllocateResult AVar6;
  ThrowOverflow local_52;
  anon_class_1_0_00000001 local_51;
  void *local_50;
  ulong local_48;
  CapTableBuilder *local_40;
  Fault local_38;
  
  ref = this->pointer;
  this_01 = this->segment;
  capTable = this->capTable;
  if (0x1ffffffe < defaultSize) {
    kj::ThrowOverflow::operator()(&local_52);
  }
  uVar5 = (ref->offsetAndKind).value;
  if ((ref->field_1).structRef != (StructRef)0x0 || uVar5 != 0) {
    if ((uVar5 & 3) == 2) {
      local_50 = defaultValue;
      local_40 = capTable;
      this_01 = BuilderArena::getSegment
                          ((BuilderArena *)(this_01->super_SegmentReader).arena,
                           (SegmentId)(ref->field_1).structRef);
      uVar5 = (ref->offsetAndKind).value;
      pwVar1 = (this_01->super_SegmentReader).ptr.ptr;
      uVar2 = (ulong)(uVar5 & 0xfffffff8);
      pWVar3 = (WirePointer *)((long)&pwVar1->content + uVar2);
      ref = (WirePointer *)((long)&pwVar1[1].content + uVar2);
      if ((uVar5 & 4) == 0) {
        pWVar4 = ref + ((int)(pWVar3->offsetAndKind).value >> 2);
        capTable = local_40;
        defaultValue = local_50;
        ref = pWVar3;
      }
      else {
        this_01 = BuilderArena::getSegment
                            ((BuilderArena *)(this_01->super_SegmentReader).arena,
                             (SegmentId)(pWVar3->field_1).structRef);
        pWVar4 = (WirePointer *)
                 ((long)&((this_01->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar3->offsetAndKind).value & 0xfffffff8));
        capTable = local_40;
        defaultValue = local_50;
      }
    }
    else {
      pWVar4 = ref + (long)((int)uVar5 >> 2) + 1;
    }
    local_48 = (ulong)defaultSize;
    if (this_01->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_01);
      defaultSize = (ByteCount)local_48;
    }
    if (((ref->offsetAndKind).value & 3) == 1) {
      uVar5 = (ref->field_1).upper32Bits;
      if ((uVar5 & 7) == 2) {
        if (uVar5 < 8) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                    (&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x689,FAILED,(char *)0x0,
                     "\"zero-size blob can\'t be text (need NUL terminator)\"",
                     (char (*) [51])"zero-size blob can\'t be text (need NUL terminator)");
          kj::_::Debug::Fault::~Fault(&local_38);
        }
        else {
          uVar2 = (ulong)((uVar5 >> 3) - 1);
          if (*(char *)((long)&(pWVar4->offsetAndKind).value + uVar2) == '\0') {
            (__return_storage_ptr__->content).ptr = (char *)pWVar4;
            (__return_storage_ptr__->content).size_ = uVar2 + 1;
            return __return_storage_ptr__;
          }
          getBlob<capnp::Text>();
        }
        defaultSize = (ByteCount)local_48;
      }
      else {
        getBlob<capnp::Text>();
      }
    }
    else {
      getBlob<capnp::Text>();
    }
  }
  if (defaultSize == 0) {
    (__return_storage_ptr__->content).ptr = &Text::Builder::nulstr;
    (__return_storage_ptr__->content).size_ = 1;
  }
  else {
    uVar5 = defaultSize + 8 >> 3;
    if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
      WireHelpers::zeroObject(this_01,capTable,ref);
    }
    pWVar4 = (WirePointer *)this_01->pos;
    if (((long)((long)(this_01->super_SegmentReader).ptr.ptr +
               ((this_01->super_SegmentReader).ptr.size_ * 8 - (long)pWVar4)) >> 3 <
         (long)(ulong)uVar5) ||
       (this_01->pos = (word *)(pWVar4 + uVar5), pWVar4 == (WirePointer *)0x0)) {
      this_00 = (BuilderArena *)(this_01->super_SegmentReader).arena;
      local_50 = defaultValue;
      if (uVar5 == 0x1fffffff) {
        WireHelpers::allocate::anon_class_1_0_00000001::operator()(&local_51);
      }
      AVar6 = BuilderArena::allocate(this_00,uVar5 + 1);
      pWVar3 = (WirePointer *)AVar6.words;
      (ref->offsetAndKind).value =
           (int)AVar6.words - *(int *)&((AVar6.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U
           | 2;
      ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                     ((AVar6.segment)->super_SegmentReader).id.value;
      (pWVar3->offsetAndKind).value = 1;
      pWVar4 = pWVar3 + 1;
      defaultValue = local_50;
    }
    else {
      (ref->offsetAndKind).value = ((uint)((ulong)((long)pWVar4 - (long)ref) >> 1) & 0xfffffffc) - 3
      ;
      pWVar3 = ref;
    }
    (pWVar3->field_1).upper32Bits = defaultSize * 8 + 10;
    (__return_storage_ptr__->content).ptr = (char *)pWVar4;
    (__return_storage_ptr__->content).size_ = (ulong)defaultSize + 1;
    memcpy(pWVar4,defaultValue,(ulong)defaultSize);
  }
  return __return_storage_ptr__;
}

Assistant:

Text::Builder PointerBuilder::getBlob<Text>(const void* defaultValue, ByteCount defaultSize) {
  return WireHelpers::getWritableTextPointer(pointer, segment, capTable, defaultValue,
      assertMax<MAX_TEXT_SIZE>(defaultSize, ThrowOverflow()));
}